

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddGenerated(Parse *pParse,Expr *pExpr,Token *pType)

{
  int iVar1;
  Table *in_RDX;
  Parse *in_RSI;
  Parse *in_RDI;
  Column *pCol;
  Table *pTab;
  u8 eType;
  Expr *in_stack_ffffffffffffffc8;
  sqlite3 *db;
  Table *pExpr_00;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  
  bVar2 = 0x20;
  pExpr_00 = in_RDI->pNewTable;
  db = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  if (pExpr_00 == (Table *)0x0) goto LAB_001b1426;
  db = (sqlite3 *)(pExpr_00->aCol + (pExpr_00->nCol + -1));
  if (in_RDI->eParseMode == '\x01') {
    sqlite3ErrorMsg(in_RDI,"virtual tables cannot use computed columns");
    goto LAB_001b1426;
  }
  if (*(u16 *)((long)&db->pVdbe + 4) == 0) {
    if ((in_RDX != (Table *)0x0) &&
       ((*(int *)&in_RDX->aCol != 7 ||
        (iVar1 = sqlite3_strnicmp("virtual",in_RDX->zName,7), iVar1 != 0)))) {
      if ((*(int *)&in_RDX->aCol != 6) ||
         (iVar1 = sqlite3_strnicmp("stored",in_RDX->zName,6), iVar1 != 0)) goto LAB_001b140b;
      bVar2 = 0x40;
    }
    if (bVar2 == 0x20) {
      pExpr_00->nNVCol = pExpr_00->nNVCol + -1;
    }
    *(ushort *)((long)&db->pVdbe + 6) = *(ushort *)((long)&db->pVdbe + 6) | (ushort)bVar2;
    pExpr_00->tabFlags = (uint)bVar2 | pExpr_00->tabFlags;
    if (((ulong)db->pVdbe & 0x1000000000000) != 0) {
      makeColumnPartOfPrimaryKey((Parse *)db,(Column *)in_stack_ffffffffffffffc8);
    }
    if ((in_RSI != (Parse *)0x0) && (*(char *)&in_RSI->db == '<')) {
      in_RSI = (Parse *)sqlite3PExpr((Parse *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),
                                     (int)((ulong)pExpr_00 >> 0x20),(Expr *)db,
                                     in_stack_ffffffffffffffc8);
    }
    if ((in_RSI != (Parse *)0x0) && (*(char *)&in_RSI->db != 'H')) {
      *(undefined1 *)((long)&in_RSI->db + 1) = *(undefined1 *)((long)&db->pVdbe + 1);
    }
    sqlite3ColumnSetExpr
              (in_RSI,in_RDX,(Column *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),(Expr *)pExpr_00);
  }
  else {
LAB_001b140b:
    sqlite3ErrorMsg(in_RDI,"error in generated column \"%s\"",(sqlite3 *)db->pVfs);
  }
LAB_001b1426:
  sqlite3ExprDelete(db,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddGenerated(Parse *pParse, Expr *pExpr, Token *pType){
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  u8 eType = COLFLAG_VIRTUAL;
  Table *pTab = pParse->pNewTable;
  Column *pCol;
  if( pTab==0 ){
    /* generated column in an CREATE TABLE IF NOT EXISTS that already exists */
    goto generated_done;
  }
  pCol = &(pTab->aCol[pTab->nCol-1]);
  if( IN_DECLARE_VTAB ){
    sqlite3ErrorMsg(pParse, "virtual tables cannot use computed columns");
    goto generated_done;
  }
  if( pCol->iDflt>0 ) goto generated_error;
  if( pType ){
    if( pType->n==7 && sqlite3StrNICmp("virtual",pType->z,7)==0 ){
      /* no-op */
    }else if( pType->n==6 && sqlite3StrNICmp("stored",pType->z,6)==0 ){
      eType = COLFLAG_STORED;
    }else{
      goto generated_error;
    }
  }
  if( eType==COLFLAG_VIRTUAL ) pTab->nNVCol--;
  pCol->colFlags |= eType;
  assert( TF_HasVirtual==COLFLAG_VIRTUAL );
  assert( TF_HasStored==COLFLAG_STORED );
  pTab->tabFlags |= eType;
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    makeColumnPartOfPrimaryKey(pParse, pCol); /* For the error message */
  }
  if( ALWAYS(pExpr) && pExpr->op==TK_ID ){
    /* The value of a generated column needs to be a real expression, not
    ** just a reference to another column, in order for covering index
    ** optimizations to work correctly.  So if the value is not an expression,
    ** turn it into one by adding a unary "+" operator. */
    pExpr = sqlite3PExpr(pParse, TK_UPLUS, pExpr, 0);
  }
  if( pExpr && pExpr->op!=TK_RAISE ) pExpr->affExpr = pCol->affinity;
  sqlite3ColumnSetExpr(pParse, pTab, pCol, pExpr);
  pExpr = 0;
  goto generated_done;

generated_error:
  sqlite3ErrorMsg(pParse, "error in generated column \"%s\"",
                  pCol->zCnName);
generated_done:
  sqlite3ExprDelete(pParse->db, pExpr);
#else
  /* Throw and error for the GENERATED ALWAYS AS clause if the
  ** SQLITE_OMIT_GENERATED_COLUMNS compile-time option is used. */
  sqlite3ErrorMsg(pParse, "generated columns not supported");
  sqlite3ExprDelete(pParse->db, pExpr);
#endif
}